

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile)

{
  bool bVar1;
  cmake *pcVar2;
  string *psVar3;
  cmGeneratedFileStream *this_00;
  ostream *poVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  undefined1 local_e8 [8];
  string sourceFileName;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  undefined1 local_60 [8];
  string buildFilePath;
  string buildFileDir;
  string *sourceFile_local;
  string *commandLine_local;
  cmGlobalNinjaGenerator *this_local;
  
  pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
  std::__cxx11::string::string((string *)(buildFilePath.field_2._M_local_buf + 8),(string *)psVar3);
  if (this->CompileCommandsStream == (cmGeneratedFileStream *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&buildFilePath.field_2 + 8),"/compile_commands.json");
    if ((this->ComputingUnknownDependencies & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"compile_commands.json",&local_b1);
      NinjaOutputPath(&local_90,this,&local_b0);
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->CombinedBuildOutputs,&local_90);
      sourceFileName.field_2._8_8_ = pVar5.first._M_node;
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
    }
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,(string *)local_60,false,None);
    this->CompileCommandsStream = this_00;
    std::operator<<((ostream *)this->CompileCommandsStream,"[");
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    poVar4 = std::operator<<((ostream *)this->CompileCommandsStream,",");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string((string *)local_e8,(string *)sourceFile);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_e8);
  if (!bVar1) {
    pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
    cmsys::SystemTools::CollapseFullPath(&local_108,(string *)local_e8,psVar3);
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  poVar4 = std::operator<<((ostream *)this->CompileCommandsStream,"\n{\n");
  poVar4 = std::operator<<(poVar4,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_128,(string *)((long)&buildFilePath.field_2 + 8));
  poVar4 = std::operator<<(poVar4,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,"\",\n");
  poVar4 = std::operator<<(poVar4,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_148,commandLine);
  poVar4 = std::operator<<(poVar4,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"\",\n");
  poVar4 = std::operator<<(poVar4,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_168,(string *)local_e8);
  poVar4 = std::operator<<(poVar4,(string *)&local_168);
  poVar4 = std::operator<<(poVar4,"\"\n");
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)(buildFilePath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath = buildFileDir + "/compile_commands.json";
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream = new cmGeneratedFileStream(buildFilePath);
    *this->CompileCommandsStream << "[";
  } else {
    *this->CompileCommandsStream << "," << std::endl;
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "\n{\n"
     << "  \"directory\": \""
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << "  \"command\": \""
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << "  \"file\": \""
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\"\n"
     << "}";
  /* clang-format on */
}